

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Id_(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
      *this)

{
  Position *this_00;
  char *pcVar1;
  bool bVar2;
  byte *pbVar3;
  char *pcVar4;
  eval_error *peVar5;
  string local_48;
  File_Position local_28;
  
  pbVar3 = (byte *)(this->m_position).m_pos;
  if (pbVar3 != (byte *)(this->m_position).m_end) {
    this_00 = &this->m_position;
    if (m_alphabet._M_elems[8]._M_elems[*pbVar3] == true) {
      do {
        if (m_alphabet._M_elems[1]._M_elems[*pbVar3] != true) {
          return true;
        }
        Position::operator++(this_00);
        pbVar3 = (byte *)(this->m_position).m_pos;
      } while (pbVar3 != (byte *)(this->m_position).m_end);
      return true;
    }
    if (*pbVar3 == 0x60) {
      Position::operator++(this_00);
      pcVar1 = (this->m_position).m_pos;
      pcVar4 = pcVar1;
      if (pcVar1 != (this->m_position).m_end) {
        do {
          if (*pcVar4 == '`') {
            if (pcVar1 != pcVar4) {
              Position::operator++(this_00);
              return true;
            }
            goto LAB_0049351e;
          }
          bVar2 = Eol(this);
          if (bVar2) {
            peVar5 = (eval_error *)__cxa_allocate_exception(0x90);
            local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_48,"Carriage return in identifier literal","");
            local_28.line = (this->m_position).line;
            local_28.column = (this->m_position).col;
            exception::eval_error::eval_error
                      (peVar5,&local_48,&local_28,
                       (this->m_filename).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
            __cxa_throw(peVar5,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
          }
          Position::operator++(this_00);
          pcVar4 = (this->m_position).m_pos;
        } while (pcVar4 != (this->m_position).m_end);
        if (pcVar1 != pcVar4) {
          peVar5 = (eval_error *)__cxa_allocate_exception(0x90);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"Incomplete identifier literal","");
          local_28.line = (this->m_position).line;
          local_28.column = (this->m_position).col;
          exception::eval_error::eval_error
                    (peVar5,&local_48,&local_28,
                     (this->m_filename).
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          __cxa_throw(peVar5,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
        }
      }
LAB_0049351e:
      peVar5 = (eval_error *)__cxa_allocate_exception(0x90);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Missing contents of identifier literal","");
      local_28.line = (this->m_position).line;
      local_28.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar5,&local_48,&local_28,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar5,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
  }
  return false;
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }